

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanBGPlanner.cpp
# Opt level: O0

QFunctionsDiscrete * __thiscall
MonahanBGPlanner::BackupStageSlow(MonahanBGPlanner *this,QFunctionsDiscrete *Qs)

{
  size_t sVar1;
  size_type __n;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_RDI;
  GaoVectorSetIndex a;
  GaobetaVectorSet G;
  int nrA;
  QFunctionsDiscrete *Qs1;
  size_t in_stack_00000320;
  undefined1 in_stack_0000032b;
  Index in_stack_0000032c;
  QFunctionsDiscrete *in_stack_00000330;
  GaobetaVectorSet *in_stack_00000338;
  MonahanBGPlanner *in_stack_00000340;
  AlphaVectorPlanning *in_stack_fffffffffffffef8;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *__a;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *this_00;
  long local_d8;
  QFunctionsDiscrete *in_stack_ffffffffffffff40;
  MonahanBGPlanner *in_stack_ffffffffffffff48;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  local_1e;
  
  __a = in_RDI;
  AlphaVectorPlanning::GetPU(in_stack_fffffffffffffef8);
  sVar1 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x939a06);
  local_1e.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._2_4_ = (int)sVar1;
  local_1e.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
  __n = (size_type)
        local_1e.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._2_4_;
  this_00 = &local_1e;
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x939a34);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(this_00,__n,(allocator_type *)__a);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::~allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x939a57);
  BackProjectMonahanBG(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  for (local_d8 = 0;
      local_d8 !=
      local_1e.
      super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._2_4_; local_d8 = local_d8 + 1) {
    MonahanCrossSum(in_stack_00000340,in_stack_00000338,in_stack_00000330,in_stack_0000032c,
                    (bool)in_stack_0000032b,in_stack_00000320);
  }
  local_1e.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = 1;
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(in_RDI);
  if ((local_1e.
       super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._1_1_ & 1) == 0) {
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)__a);
  }
  return (QFunctionsDiscrete *)in_RDI;
}

Assistant:

QFunctionsDiscrete
MonahanBGPlanner::BackupStageSlow(const QFunctionsDiscrete &Qs)
{
    int nrA=GetPU()->GetNrJointActions();
    QFunctionsDiscrete Qs1(nrA);

    GaobetaVectorSet G=BackProjectMonahanBG(Qs);

    // Do the cross-sums, results are stored in V1
    for(GaoVectorSetIndex a=0;a!=nrA;a++)
        MonahanCrossSum(G,Qs1,a,_m_doIncPrune);

    return(Qs1);
}